

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

reference __thiscall
QVLABase<QGles2UniformDescription>::emplace_back_impl<QGles2UniformDescription>
          (QVLABase<QGles2UniformDescription> *this,qsizetype prealloc,void *array,
          QGles2UniformDescription *args)

{
  qsizetype *pqVar1;
  void *pvVar2;
  undefined8 uVar3;
  long lVar4;
  
  lVar4 = (this->super_QVLABaseBase).s;
  if (lVar4 == (this->super_QVLABaseBase).a) {
    growBy(this,prealloc,array,1);
    lVar4 = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (this->super_QVLABaseBase).ptr;
  lVar4 = lVar4 * 0x18;
  *(undefined8 *)((long)pvVar2 + lVar4 + 0x10) = *(undefined8 *)&args->size;
  uVar3 = *(undefined8 *)&args->binding;
  *(undefined8 *)((long)pvVar2 + lVar4) = *(undefined8 *)args;
  ((undefined8 *)((long)pvVar2 + lVar4))[1] = uVar3;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)((long)pvVar2 + lVar4);
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }